

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmo.c
# Opt level: O0

int extract_motion_vectors(char *videopath)

{
  int iVar1;
  stat sb;
  AVPacket pkt;
  int ret;
  char *videopath_local;
  
  pkt.convergence_duration._4_4_ = 0;
  memset(sb.__glibc_reserved + 2,0,0x58);
  src_filename = videopath;
  iVar1 = avformat_open_input(&fmt_ctx,videopath,0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Could not open source file %s\n",src_filename);
    exit(1);
  }
  iVar1 = avformat_find_stream_info(fmt_ctx);
  if (iVar1 < 0) {
    fprintf(_stderr,"Could not find stream information\n");
    exit(1);
  }
  open_codec_context(fmt_ctx,AVMEDIA_TYPE_VIDEO);
  av_dump_format(fmt_ctx,0,src_filename);
  if (video_stream == (AVStream *)0x0) {
    fprintf(_stderr,"Could not find video stream in the input, aborting\n");
    pkt.convergence_duration._4_4_ = 1;
  }
  else {
    frame = (AVFrame *)av_frame_alloc();
    if (frame == (AVFrame *)0x0) {
      fprintf(_stderr,"Could not allocate frame\n");
      pkt.convergence_duration._4_4_ = -0xc;
    }
    else {
      printf("\n");
      printf(
            "**************************************************************************************\n"
            );
      printf(
            "*       Tool : MV-Tractus                                                            *\n"
            );
      printf(
            "*     Author : Jishnu Jaykumar Padalunkal (https://jishnujayakumar.github.io)        *\n"
            );
      printf(
            "*  Used Libs : FFmpeg                                                                *\n"
            );
      printf(
            "*Description : A simple tool to extract motion vectors from MPEG videos              *\n"
            );
      printf(
            "**************************************************************************************\n"
            );
      printf("\n");
      printf(
            "--------------------------------------------------------------------------------------\n"
            );
      printf(
            "framenum,source,blockw,blockh,srcx,srcy,dstx,dsty,motion_x,motion_y,motion_scale,flags\n"
            );
      printf(
            "--------------------------------------------------------------------------------------\n"
            );
      do {
        iVar1 = av_read_frame(fmt_ctx,sb.__glibc_reserved + 2);
        if (iVar1 < 0) break;
        if (pkt.data._4_4_ == video_stream_idx) {
          pkt.convergence_duration._4_4_ = decode_packet((AVPacket *)(sb.__glibc_reserved + 2));
        }
        av_packet_unref(sb.__glibc_reserved + 2);
      } while (-1 < pkt.convergence_duration._4_4_);
      decode_packet((AVPacket *)0x0);
      printf(
            "\n--------------------------------------------------------------------------------------\n"
            );
    }
  }
  avcodec_free_context(&video_dec_ctx);
  avformat_close_input(&fmt_ctx);
  av_frame_free(&frame);
  return (int)(pkt.convergence_duration._4_4_ < 0);
}

Assistant:

int extract_motion_vectors(char *videopath){
    int ret = 0;
    AVPacket pkt = { 0 };
    struct stat sb;
    // char command[50];
    // char output[13]="./output/mv/";
    // if (!(stat(output, &sb) == 0 && S_ISDIR(sb.st_mode)))
    // {
    //     sprintf(command,"mkdir %s", output);
	  //     system(command);
    // }

    /*if (argc != 2) {
        fprintf(stderr, "Usage: %s <video>\n", argv[0]);
        exit(1);
    }*/

    src_filename = videopath;

    if (avformat_open_input(&fmt_ctx, src_filename, NULL, NULL) < 0) {
        fprintf(stderr, "Could not open source file %s\n", src_filename);
        exit(1);
    }

    if (avformat_find_stream_info(fmt_ctx, NULL) < 0) {
        fprintf(stderr, "Could not find stream information\n");
        exit(1);
    }

    open_codec_context(fmt_ctx, AVMEDIA_TYPE_VIDEO);

    av_dump_format(fmt_ctx, 0, src_filename, 0);

    if (!video_stream) {
        fprintf(stderr, "Could not find video stream in the input, aborting\n");
        ret = 1;
        goto end;
    }

    frame = av_frame_alloc();
    if (!frame) {
        fprintf(stderr, "Could not allocate frame\n");
        ret = AVERROR(ENOMEM);
        goto end;
    }
    printf("\n");
    printf("**************************************************************************************\n");
    printf("*       Tool : MV-Tractus                                                            *\n");
    printf("*     Author : Jishnu Jaykumar Padalunkal (https://jishnujayakumar.github.io)        *\n");
    printf("*  Used Libs : FFmpeg                                                                *\n");
    printf("*Description : A simple tool to extract motion vectors from MPEG videos              *\n");
    printf("**************************************************************************************\n");
    printf("\n");
    printf("--------------------------------------------------------------------------------------\n");
    printf("framenum,source,blockw,blockh,srcx,srcy,dstx,dsty,motion_x,motion_y,motion_scale,flags\n");
    printf("--------------------------------------------------------------------------------------\n");

    /* read frames from the file */
    while (av_read_frame(fmt_ctx, &pkt) >= 0) {
        if (pkt.stream_index == video_stream_idx)
            ret = decode_packet(&pkt);
        av_packet_unref(&pkt);
        if (ret < 0)
            break;
    }

    /* flush cached frames */
    decode_packet(NULL);
    printf("\n--------------------------------------------------------------------------------------\n");

end:
    avcodec_free_context(&video_dec_ctx);
    avformat_close_input(&fmt_ctx);
    av_frame_free(&frame);
    return ret < 0;
}